

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IndexType.cpp
# Opt level: O3

istream * amrex::operator>>(istream *is,IndexType *it)

{
  istream *piVar1;
  char t2;
  char t1;
  char t0;
  char local_2b;
  char local_2a;
  char local_29;
  
  piVar1 = (istream *)std::istream::ignore((long)is,100000);
  std::operator>>(piVar1,&local_29);
  piVar1 = (istream *)std::istream::ignore((long)is,100000);
  std::operator>>(piVar1,&local_2a);
  piVar1 = (istream *)std::istream::ignore((long)is,100000);
  std::operator>>(piVar1,&local_2b);
  std::istream::ignore((long)is,100000);
  it->itype = ((uint)(local_29 == 'N') | it->itype & 0xfffffff8) + (uint)(local_2a == 'N') * 2 +
              (uint)(local_2b == 'N') * 4;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
    Error_host("operator>>(ostream&,IndexType&) failed");
  }
  return is;
}

Assistant:

std::istream&
operator>> (std::istream& is,
            IndexType&    it)
{
    char AMREX_D_DECL(t0,t1,t2);

    AMREX_D_EXPR( is.ignore(BL_IGNORE_MAX, '(') >> t0,
            is.ignore(BL_IGNORE_MAX, ',') >> t1,
            is.ignore(BL_IGNORE_MAX, ',') >> t2);
    is.ignore(BL_IGNORE_MAX, ')');
    AMREX_D_TERM(
        BL_ASSERT(t0 == 'C' || t0 == 'N'); t0=='N'?it.set(0):it.unset(0); ,
        BL_ASSERT(t1 == 'C' || t1 == 'N'); t1=='N'?it.set(1):it.unset(1); ,
        BL_ASSERT(t2 == 'C' || t2 == 'N'); t2=='N'?it.set(2):it.unset(2));

    if (is.fail())
        amrex::Error("operator>>(ostream&,IndexType&) failed");

    return is;
}